

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransport_amqp_telemetry_messenger.c
# Opt level: O0

int telemetry_messenger_start
              (TELEMETRY_MESSENGER_HANDLE messenger_handle,SESSION_HANDLE session_handle)

{
  LOGGER_LOG p_Var1;
  LOGGER_LOG l_2;
  TELEMETRY_MESSENGER_INSTANCE_conflict *instance;
  LOGGER_LOG l_1;
  LOGGER_LOG l;
  int result;
  SESSION_HANDLE session_handle_local;
  TELEMETRY_MESSENGER_HANDLE messenger_handle_local;
  
  if (messenger_handle == (TELEMETRY_MESSENGER_HANDLE)0x0) {
    l._4_4_ = 0x655;
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_telemetry_messenger.c"
                ,"telemetry_messenger_start",0x656,1,
                "telemetry_messenger_start failed (messenger_handle is NULL)");
    }
  }
  else if (session_handle == (SESSION_HANDLE)0x0) {
    l._4_4_ = 0x65a;
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_telemetry_messenger.c"
                ,"telemetry_messenger_start",0x65b,1,
                "telemetry_messenger_start failed (session_handle is NULL)");
    }
  }
  else if (messenger_handle->state == TELEMETRY_MESSENGER_STATE_STOPPED) {
    messenger_handle->session_handle = session_handle;
    update_messenger_state(messenger_handle,TELEMETRY_MESSENGER_STATE_STARTING);
    l._4_4_ = 0;
  }
  else {
    l._4_4_ = 0x663;
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_telemetry_messenger.c"
                ,"telemetry_messenger_start",0x664,1,
                "telemetry_messenger_start failed (current state is %d; expected TELEMETRY_MESSENGER_STATE_STOPPED)"
                ,messenger_handle->state);
    }
  }
  return l._4_4_;
}

Assistant:

int telemetry_messenger_start(TELEMETRY_MESSENGER_HANDLE messenger_handle, SESSION_HANDLE session_handle)
{
    int result;

    if (messenger_handle == NULL)
    {
        result = MU_FAILURE;
        LogError("telemetry_messenger_start failed (messenger_handle is NULL)");
    }
    else if (session_handle == NULL)
    {
        result = MU_FAILURE;
        LogError("telemetry_messenger_start failed (session_handle is NULL)");
    }
    else
    {
        TELEMETRY_MESSENGER_INSTANCE* instance = (TELEMETRY_MESSENGER_INSTANCE*)messenger_handle;

        if (instance->state != TELEMETRY_MESSENGER_STATE_STOPPED)
        {
            result = MU_FAILURE;
            LogError("telemetry_messenger_start failed (current state is %d; expected TELEMETRY_MESSENGER_STATE_STOPPED)", instance->state);
        }
        else
        {
            instance->session_handle = session_handle;

            update_messenger_state(instance, TELEMETRY_MESSENGER_STATE_STARTING);

            result = RESULT_OK;
        }
    }

    return result;
}